

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O3

void init_noise(void)

{
  int *piVar1;
  int *piVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double local_20;
  double local_18;
  double local_10;
  
  lVar4 = 0;
  srand(0);
  piVar2 = (int *)operator_new__(0x4000);
  iVar8 = 0;
  iVar9 = 1;
  iVar10 = 2;
  iVar11 = 3;
  hash_table = piVar2;
  do {
    piVar1 = piVar2 + lVar4;
    *piVar1 = iVar8;
    piVar1[1] = iVar9;
    piVar1[2] = iVar10;
    piVar1[3] = iVar11;
    lVar4 = lVar4 + 4;
    iVar8 = iVar8 + 4;
    iVar9 = iVar9 + 4;
    iVar10 = iVar10 + 4;
    iVar11 = iVar11 + 4;
  } while (lVar4 != 0x1000);
  uVar5 = 0x1000;
  do {
    iVar8 = rand();
    piVar2 = hash_table;
    iVar9 = (int)(((double)iVar8 / 2147483647.0) * 4096.0);
    iVar8 = hash_table[uVar5 - 1];
    hash_table[uVar5 - 1] = hash_table[iVar9];
    piVar2[iVar9] = iVar8;
    uVar5 = uVar5 - 1;
  } while (1 < uVar5);
  pdVar3 = (double *)operator_new__(0x858);
  lVar4 = 0;
  noise_table = pdVar3;
  do {
    local_20 = (double)(int)lVar4 * 0.12345;
    local_18 = local_20;
    local_10 = local_20;
    lVar6 = 0;
    uVar5 = 0;
    do {
      uVar7 = (uint)crctab[(byte)((byte)uVar5 ^ *(byte *)((long)&local_20 + lVar6))] ^
              (uint)(uVar5 >> 8);
      uVar5 = (ulong)uVar7;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 0x18);
    pdVar3[lVar4] = (double)uVar7 * 3.0518043793392844e-05 + -1.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10b);
  return;
}

Assistant:

void init_noise()
{
   int   i, j, k;
   Vector rp;

   srand(0);
   //
   // Init hash table
   //
   hash_table = new int [4096];
   for( i = 0; i <   4096; i++ )
      hash_table[i] =   i;

   for( i = 4095; i > 0; i-- )
   {
      j =   (int)(rnd() * 4096.0);
      k =   hash_table[i];
      hash_table[i] =   hash_table[j];
      hash_table[j] =   k;
   }
   //
   // Init noise table
   //
   noise_table = new double [max_noise_size];

   for( i = 0; i <   max_noise_size;   i++   )
   {
      rp = (double)i;
      noise_table[i] = R(rp) * REALSCALE - 1.0;

#if   !defined(FINAL)
//    printf("NoiseTable[%d] == %g\n",i,NoiseTable[i]);
#endif

   }
}